

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void __thiscall TestArgsBase::~TestArgsBase(TestArgsBase *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  
  this->_vptr_TestArgsBase = (_func_int **)&PTR__TestArgsBase_00111bd8;
  p_Var1 = (this->testFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->testFunction,(_Any_data *)&this->testFunction,__destroy_functor);
  }
  pcVar2 = (this->testName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->testName).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

virtual ~TestArgsBase() { }